

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O2

bool __thiscall
vectorgraphics::TikzPlotter::compileTexFile(TikzPlotter *this,path *path,string *name)

{
  int iVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"cd ");
  pbVar3 = std::filesystem::__cxx11::operator<<(poVar2,path);
  poVar2 = std::operator<<(pbVar3," && lualatex --halt-on-error ");
  std::operator+(&local_1b0,name,".tex");
  poVar2 = std::operator<<(poVar2,(string *)&local_1b0);
  std::operator<<(poVar2,">/dev/null");
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringbuf::str();
  iVar1 = system(local_1b0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_1b0);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Error in compileTexFile: lualatex call not succesful");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return iVar1 == 0;
}

Assistant:

bool TikzPlotter::compileTexFile(std::filesystem::path path, std::string name) const {
    std::ostringstream oss;
    oss << "cd " << path << " && lualatex --halt-on-error " << (name + ".tex") << ">/dev/null";
    auto ret = std::system(oss.str().c_str());
    if (ret != 0) {
      std::cout << "Error in compileTexFile: lualatex call not succesful" << std::endl;
      return false;
    }
    return true;
  }